

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct64x64_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  int iVar2;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  __m128i *in_RDI;
  int in_R8D;
  uint in_R9D;
  int extraout_XMM0_Da;
  uint uVar3;
  int extraout_XMM0_Db;
  uint uVar4;
  int extraout_XMM0_Dc;
  uint uVar5;
  int extraout_XMM0_Dd;
  uint uVar6;
  __m128i offset;
  int log_range_out;
  __m128i x;
  __m128i cospi32;
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  __m128i rnding;
  int32_t *cospi;
  char local_250;
  int local_24c;
  undefined8 local_228;
  undefined8 uStack_220;
  longlong local_218;
  longlong lStack_210;
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1dc;
  longlong local_1d8;
  longlong lStack_1d0;
  int32_t *local_1c0;
  uint local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  undefined8 *local_1a8;
  __m128i *local_1a0;
  int32_t local_168;
  int local_164;
  int local_160;
  int local_15c;
  longlong local_158;
  longlong lStack_150;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  longlong local_f8;
  longlong lStack_f0;
  int32_t local_e8;
  int32_t local_e4;
  int32_t local_e0;
  int32_t local_dc;
  
  local_1b8 = in_R9D;
  local_1b4 = in_R8D;
  local_1b0 = in_ECX;
  local_1ac = in_EDX;
  local_1a8 = in_RSI;
  local_1a0 = in_RDI;
  local_1c0 = cospi_arr(in_EDX);
  local_15c = 1 << ((char)local_1ac - 1U & 0x1f);
  local_1d8 = CONCAT44(local_15c,local_15c);
  lStack_1d0 = CONCAT44(local_15c,local_15c);
  iVar2 = 8;
  if (local_1b0 != 0) {
    iVar2 = 6;
  }
  if (local_1b4 + iVar2 < 0x10) {
    local_24c = 0x10;
  }
  else {
    local_24c = 8;
    if (local_1b0 != 0) {
      local_24c = 6;
    }
    local_24c = local_1b4 + local_24c;
  }
  local_1dc = local_24c;
  iVar2 = local_1dc;
  local_1dc._0_1_ = (char)local_24c;
  local_160 = -(1 << ((char)local_1dc - 1U & 0x1f));
  local_164 = (1 << ((char)local_1dc - 1U & 0x1f)) + -1;
  local_168 = local_1c0[0x20];
  local_218 = CONCAT44(local_168,local_168);
  lStack_210 = CONCAT44(local_168,local_168);
  local_1dc = iVar2;
  local_158 = local_1d8;
  lStack_150 = lStack_1d0;
  local_148 = local_15c;
  local_144 = local_15c;
  local_140 = local_15c;
  local_13c = local_15c;
  local_128 = local_160;
  local_124 = local_160;
  local_120 = local_160;
  local_11c = local_160;
  local_108 = local_164;
  local_104 = local_164;
  local_100 = local_164;
  local_fc = local_164;
  local_f8 = local_218;
  lStack_f0 = lStack_210;
  local_e8 = local_168;
  local_e4 = local_168;
  local_e0 = local_168;
  local_dc = local_168;
  local_1f8 = local_160;
  iStack_1f4 = local_160;
  local_138 = local_160;
  iStack_134 = local_160;
  iStack_1f0 = local_160;
  iStack_1ec = local_160;
  iStack_130 = local_160;
  iStack_12c = local_160;
  local_208 = local_164;
  iStack_204 = local_164;
  local_118 = local_164;
  iStack_114 = local_164;
  iStack_200 = local_164;
  iStack_1fc = local_164;
  iStack_110 = local_164;
  iStack_10c = local_164;
  half_btf_0_sse4_1((__m128i *)&local_218,local_1a0,(__m128i *)&local_1d8,local_1ac);
  local_228._0_4_ = extraout_XMM0_Da;
  local_228._4_4_ = extraout_XMM0_Db;
  uStack_220._0_4_ = extraout_XMM0_Dc;
  uStack_220._4_4_ = extraout_XMM0_Dd;
  if (local_1b0 == 0) {
    if (local_1b4 + 6 < 0x10) {
      local_250 = '\x10';
    }
    else {
      local_250 = (char)local_1b4 + '\x06';
    }
    local_1f8 = -(1 << (local_250 - 1U & 0x1f));
    local_208 = (1 << (local_250 - 1U & 0x1f)) + -1;
    iStack_1f4 = local_1f8;
    iStack_1f0 = local_1f8;
    iStack_1ec = local_1f8;
    iStack_204 = local_208;
    iStack_200 = local_208;
    iStack_1fc = local_208;
    if (local_1b8 != 0) {
      iVar2 = (1 << ((byte)local_1b8 & 0x1f)) >> 1;
      auVar1 = ZEXT416(local_1b8);
      local_228._0_4_ = extraout_XMM0_Da + iVar2 >> auVar1;
      local_228._4_4_ = extraout_XMM0_Db + iVar2 >> auVar1;
      uStack_220._0_4_ = extraout_XMM0_Dc + iVar2 >> auVar1;
      uStack_220._4_4_ = extraout_XMM0_Dd + iVar2 >> auVar1;
    }
  }
  uVar3 = (uint)((int)local_228 < local_1f8) * local_1f8 |
          (uint)((int)local_228 >= local_1f8) * (int)local_228;
  uVar4 = (uint)(local_228._4_4_ < iStack_1f4) * iStack_1f4 |
          (uint)(local_228._4_4_ >= iStack_1f4) * local_228._4_4_;
  uVar5 = (uint)((int)uStack_220 < iStack_1f0) * iStack_1f0 |
          (uint)((int)uStack_220 >= iStack_1f0) * (int)uStack_220;
  uVar6 = (uint)(uStack_220._4_4_ < iStack_1ec) * iStack_1ec |
          (uint)(uStack_220._4_4_ >= iStack_1ec) * uStack_220._4_4_;
  local_228 = CONCAT44((uint)(iStack_204 < (int)uVar4) * iStack_204 |
                       (iStack_204 >= (int)uVar4) * uVar4,
                       (uint)(local_208 < (int)uVar3) * local_208 |
                       (local_208 >= (int)uVar3) * uVar3);
  uStack_220 = CONCAT44((uint)(iStack_1fc < (int)uVar6) * iStack_1fc |
                        (iStack_1fc >= (int)uVar6) * uVar6,
                        (uint)(iStack_200 < (int)uVar5) * iStack_200 |
                        (iStack_200 >= (int)uVar5) * uVar5);
  *local_1a8 = local_228;
  local_1a8[1] = uStack_220;
  local_1a8[2] = local_228;
  local_1a8[3] = uStack_220;
  local_1a8[4] = local_228;
  local_1a8[5] = uStack_220;
  local_1a8[6] = local_228;
  local_1a8[7] = uStack_220;
  local_1a8[8] = local_228;
  local_1a8[9] = uStack_220;
  local_1a8[10] = local_228;
  local_1a8[0xb] = uStack_220;
  local_1a8[0xc] = local_228;
  local_1a8[0xd] = uStack_220;
  local_1a8[0xe] = local_228;
  local_1a8[0xf] = uStack_220;
  local_1a8[0x10] = local_228;
  local_1a8[0x11] = uStack_220;
  local_1a8[0x12] = local_228;
  local_1a8[0x13] = uStack_220;
  local_1a8[0x14] = local_228;
  local_1a8[0x15] = uStack_220;
  local_1a8[0x16] = local_228;
  local_1a8[0x17] = uStack_220;
  local_1a8[0x18] = local_228;
  local_1a8[0x19] = uStack_220;
  local_1a8[0x1a] = local_228;
  local_1a8[0x1b] = uStack_220;
  local_1a8[0x1c] = local_228;
  local_1a8[0x1d] = uStack_220;
  local_1a8[0x1e] = local_228;
  local_1a8[0x1f] = uStack_220;
  local_1a8[0x20] = local_228;
  local_1a8[0x21] = uStack_220;
  local_1a8[0x22] = local_228;
  local_1a8[0x23] = uStack_220;
  local_1a8[0x24] = local_228;
  local_1a8[0x25] = uStack_220;
  local_1a8[0x26] = local_228;
  local_1a8[0x27] = uStack_220;
  local_1a8[0x28] = local_228;
  local_1a8[0x29] = uStack_220;
  local_1a8[0x2a] = local_228;
  local_1a8[0x2b] = uStack_220;
  local_1a8[0x2c] = local_228;
  local_1a8[0x2d] = uStack_220;
  local_1a8[0x2e] = local_228;
  local_1a8[0x2f] = uStack_220;
  local_1a8[0x30] = local_228;
  local_1a8[0x31] = uStack_220;
  local_1a8[0x32] = local_228;
  local_1a8[0x33] = uStack_220;
  local_1a8[0x34] = local_228;
  local_1a8[0x35] = uStack_220;
  local_1a8[0x36] = local_228;
  local_1a8[0x37] = uStack_220;
  local_1a8[0x38] = local_228;
  local_1a8[0x39] = uStack_220;
  local_1a8[0x3a] = local_228;
  local_1a8[0x3b] = uStack_220;
  local_1a8[0x3c] = local_228;
  local_1a8[0x3d] = uStack_220;
  local_1a8[0x3e] = local_228;
  local_1a8[0x3f] = uStack_220;
  local_1a8[0x40] = local_228;
  local_1a8[0x41] = uStack_220;
  local_1a8[0x42] = local_228;
  local_1a8[0x43] = uStack_220;
  local_1a8[0x44] = local_228;
  local_1a8[0x45] = uStack_220;
  local_1a8[0x46] = local_228;
  local_1a8[0x47] = uStack_220;
  local_1a8[0x48] = local_228;
  local_1a8[0x49] = uStack_220;
  local_1a8[0x4a] = local_228;
  local_1a8[0x4b] = uStack_220;
  local_1a8[0x4c] = local_228;
  local_1a8[0x4d] = uStack_220;
  local_1a8[0x4e] = local_228;
  local_1a8[0x4f] = uStack_220;
  local_1a8[0x50] = local_228;
  local_1a8[0x51] = uStack_220;
  local_1a8[0x52] = local_228;
  local_1a8[0x53] = uStack_220;
  local_1a8[0x54] = local_228;
  local_1a8[0x55] = uStack_220;
  local_1a8[0x56] = local_228;
  local_1a8[0x57] = uStack_220;
  local_1a8[0x58] = local_228;
  local_1a8[0x59] = uStack_220;
  local_1a8[0x5a] = local_228;
  local_1a8[0x5b] = uStack_220;
  local_1a8[0x5c] = local_228;
  local_1a8[0x5d] = uStack_220;
  local_1a8[0x5e] = local_228;
  local_1a8[0x5f] = uStack_220;
  local_1a8[0x60] = local_228;
  local_1a8[0x61] = uStack_220;
  local_1a8[0x62] = local_228;
  local_1a8[99] = uStack_220;
  local_1a8[100] = local_228;
  local_1a8[0x65] = uStack_220;
  local_1a8[0x66] = local_228;
  local_1a8[0x67] = uStack_220;
  local_1a8[0x68] = local_228;
  local_1a8[0x69] = uStack_220;
  local_1a8[0x6a] = local_228;
  local_1a8[0x6b] = uStack_220;
  local_1a8[0x6c] = local_228;
  local_1a8[0x6d] = uStack_220;
  local_1a8[0x6e] = local_228;
  local_1a8[0x6f] = uStack_220;
  local_1a8[0x70] = local_228;
  local_1a8[0x71] = uStack_220;
  local_1a8[0x72] = local_228;
  local_1a8[0x73] = uStack_220;
  local_1a8[0x74] = local_228;
  local_1a8[0x75] = uStack_220;
  local_1a8[0x76] = local_228;
  local_1a8[0x77] = uStack_220;
  local_1a8[0x78] = local_228;
  local_1a8[0x79] = uStack_220;
  local_1a8[0x7a] = local_228;
  local_1a8[0x7b] = uStack_220;
  local_1a8[0x7c] = local_228;
  local_1a8[0x7d] = uStack_220;
  local_1a8[0x7e] = local_228;
  local_1a8[0x7f] = uStack_220;
  return;
}

Assistant:

static void idct64x64_low1_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);

  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);

  {
    __m128i x;

    // stage 1
    // stage 2
    // stage 3
    // stage 4
    // stage 5
    // stage 6
    x = half_btf_0_sse4_1(&cospi32, &in[0], &rnding, bit);

    // stage 8
    // stage 9
    // stage 10
    // stage 11
    if (!do_cols) {
      const int log_range_out = AOMMAX(16, bd + 6);
      clamp_lo = _mm_set1_epi32(-(1 << (log_range_out - 1)));
      clamp_hi = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
      if (out_shift != 0) {
        __m128i offset = _mm_set1_epi32((1 << out_shift) >> 1);
        x = _mm_add_epi32(x, offset);
        x = _mm_sra_epi32(x, _mm_cvtsi32_si128(out_shift));
      }
    }
    x = _mm_max_epi32(x, clamp_lo);
    x = _mm_min_epi32(x, clamp_hi);
    out[0] = x;
    out[1] = x;
    out[2] = x;
    out[3] = x;
    out[4] = x;
    out[5] = x;
    out[6] = x;
    out[7] = x;
    out[8] = x;
    out[9] = x;
    out[10] = x;
    out[11] = x;
    out[12] = x;
    out[13] = x;
    out[14] = x;
    out[15] = x;
    out[16] = x;
    out[17] = x;
    out[18] = x;
    out[19] = x;
    out[20] = x;
    out[21] = x;
    out[22] = x;
    out[23] = x;
    out[24] = x;
    out[25] = x;
    out[26] = x;
    out[27] = x;
    out[28] = x;
    out[29] = x;
    out[30] = x;
    out[31] = x;
    out[32] = x;
    out[33] = x;
    out[34] = x;
    out[35] = x;
    out[36] = x;
    out[37] = x;
    out[38] = x;
    out[39] = x;
    out[40] = x;
    out[41] = x;
    out[42] = x;
    out[43] = x;
    out[44] = x;
    out[45] = x;
    out[46] = x;
    out[47] = x;
    out[48] = x;
    out[49] = x;
    out[50] = x;
    out[51] = x;
    out[52] = x;
    out[53] = x;
    out[54] = x;
    out[55] = x;
    out[56] = x;
    out[57] = x;
    out[58] = x;
    out[59] = x;
    out[60] = x;
    out[61] = x;
    out[62] = x;
    out[63] = x;
  }
}